

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O0

void do_cmd_wiz_change_item_quantity(command_conflict *cmd)

{
  ushort uVar1;
  _Bool _Var2;
  wchar_t wVar3;
  wchar_t local_ec;
  wchar_t local_e8;
  wchar_t local_e4;
  uint local_e0;
  wchar_t local_d8;
  uint local_d4;
  wchar_t local_cc;
  char local_c8 [8];
  char s [80];
  char prompt [80];
  wchar_t local_20;
  wchar_t update;
  wchar_t nmax;
  wchar_t n;
  object *obj;
  command_conflict *cmd_local;
  
  prompt[0x4c] = '\0';
  prompt[0x4d] = '\0';
  prompt[0x4e] = '\0';
  prompt[0x4f] = '\0';
  obj = (object *)cmd;
  wVar3 = cmd_get_arg_item((command *)cmd,"item",(object **)&nmax);
  if (wVar3 == L'\0') {
    _Var2 = object_is_equipped(player->body,_nmax);
    if (_Var2) {
      msg("Can not change the quantity of an equipped item.");
      return;
    }
  }
  else {
    _Var2 = get_item((object **)&nmax,"Change quantity of which item? ",
                     "You have nothing to change.",*(cmd_code *)((long)&obj->kind + 4),
                     (item_tester)0x0,L'\x0e');
    if (!_Var2) {
      return;
    }
    cmd_set_arg_item((command *)obj,"item",_nmax);
  }
  if (_nmax->artifact == (artifact *)0x0) {
    local_cc = _nmax->kind->base->max_stack;
    _Var2 = tval_can_have_charges(_nmax);
    local_20 = local_cc;
    if (((_Var2) && (0 < _nmax->pval)) && (_nmax->number != '\0')) {
      if ((wchar_t)((long)(ulong)((uint)_nmax->number * 0x7fff) / (long)(int)_nmax->pval) <=
          local_cc) {
        local_cc = (wchar_t)((long)(ulong)((uint)_nmax->number * 0x7fff) / (long)(int)_nmax->pval);
      }
      local_20 = local_cc;
    }
    _Var2 = object_is_in_quiver(player,_nmax);
    if (_Var2) {
      uVar1 = z_info->quiver_slot_size;
      _Var2 = tval_is_ammo(_nmax);
      if (_Var2) {
        local_d4 = 1;
      }
      else {
        local_d4 = (uint)z_info->thrown_quiver_mult;
      }
      if (local_20 < (int)(uVar1 / local_d4)) {
        local_d8 = local_20;
      }
      else {
        uVar1 = z_info->quiver_slot_size;
        _Var2 = tval_is_ammo(_nmax);
        if (_Var2) {
          local_e0 = 1;
        }
        else {
          local_e0 = (uint)z_info->thrown_quiver_mult;
        }
        local_d8 = uVar1 / local_e0;
      }
      local_20 = local_d8;
    }
    wVar3 = cmd_get_arg_number((command *)obj,"quantity",&update);
    if (wVar3 != L'\0') {
      strnfmt(s + 0x48,0x50,"Quantity (1-%d): ",(ulong)(uint)local_20);
      strnfmt(local_c8,0x50,"%d",(ulong)_nmax->number);
      _Var2 = get_string(s + 0x48,local_c8,0x50);
      if (!_Var2) {
        return;
      }
      _Var2 = get_int_from_string(local_c8,&update);
      if (!_Var2) {
        return;
      }
      if (update < L'\x01') {
        return;
      }
      if (_nmax->kind->base->max_stack < update) {
        return;
      }
      cmd_set_arg_number((command *)obj,"quantity",update);
    }
    if (update < local_20) {
      local_e4 = update;
    }
    else {
      local_e4 = local_20;
    }
    if (local_e4 < L'\x02') {
      local_ec = L'\x01';
    }
    else {
      if (update < local_20) {
        local_e8 = update;
      }
      else {
        local_e8 = local_20;
      }
      local_ec = local_e8;
    }
    update = local_ec;
    if (local_ec != (uint)_nmax->number) {
      _Var2 = tval_can_have_charges(_nmax);
      if ((_Var2) && (_nmax->number != '\0')) {
        _nmax->pval = (int16_t)((_nmax->pval * update) / (int)(uint)_nmax->number);
      }
      _Var2 = tval_can_have_timeout(_nmax);
      if ((_Var2) && (_nmax->number != '\0')) {
        _nmax->timeout = (int16_t)((_nmax->timeout * update) / (int)(uint)_nmax->number);
      }
      wVar3 = cmd_get_arg_choice((command *)obj,"update",(int *)(prompt + 0x4c));
      if ((wVar3 == L'\0') && (prompt._76_4_ == 0)) {
        wiz_play_item_notify_changed();
      }
      else {
        _Var2 = object_is_carried(player,_nmax);
        if (_Var2) {
          player->upkeep->total_weight =
               player->upkeep->total_weight - (uint)_nmax->number * (int)_nmax->weight;
          player->upkeep->total_weight = update * _nmax->weight + player->upkeep->total_weight;
        }
        wiz_play_item_standard_upkeep(player,_nmax);
      }
      _nmax->number = (uint8_t)update;
    }
  }
  else {
    msg("Can not modify the quantity of an artifact.");
  }
  return;
}

Assistant:

void do_cmd_wiz_change_item_quantity(struct command *cmd)
{
	struct object *obj;
	int n, nmax;
	int update = 0;

	if (cmd_get_arg_item(cmd, "item", &obj) != CMD_OK) {
		if (!get_item(&obj, "Change quantity of which item? ",
				"You have nothing to change.", cmd->code,
				NULL, (USE_INVEN | USE_QUIVER | USE_FLOOR))) {
			return;
		}
		cmd_set_arg_item(cmd, "item", obj);
	} else if (object_is_equipped(player->body, obj)) {
		msg("Can not change the quantity of an equipped item.");
		return;
	}

	/* Don't allow multiple artifacts. */
	if (obj->artifact) {
		msg("Can not modify the quantity of an artifact.");
		return;
	}

	/* Find limit on stack size. */
	nmax = obj->kind->base->max_stack;
	if (tval_can_have_charges(obj) && obj->pval > 0 && obj->number > 0) {
		/* Items with charges have a limit imposed by MAX_PVAL. */
		nmax = MIN((MAX_PVAL * obj->number) / obj->pval, nmax);
	}
	if (object_is_in_quiver(player, obj)) {
		/* The quiver may have stricter limits. */
		nmax = MIN(z_info->quiver_slot_size /
			(tval_is_ammo(obj) ? 1 : z_info->thrown_quiver_mult),
			nmax);
	}

	/* Get the new quantity. */
	if (cmd_get_arg_number(cmd, "quantity", &n) != CMD_OK) {
		char prompt[80], s[80];

		strnfmt(prompt, sizeof(prompt), "Quantity (1-%d): ", nmax);

		/* Set the default value. */
		strnfmt(s, sizeof(s), "%d", obj->number);

		if (!get_string(prompt, s, sizeof(s)) ||
				!get_int_from_string(s, &n) ||
				n < 1 || n > obj->kind->base->max_stack) {
			return;
		}

		cmd_set_arg_number(cmd, "quantity", n);
	}

	/* Impose limits. */
	n = MAX(1, MIN(nmax, n));

	if (n != obj->number) {
		/* Adjust charges or timeouts for devices. */
		if (tval_can_have_charges(obj) && obj->number > 0) {
			obj->pval = (obj->pval * n) / obj->number;
		}
		if (tval_can_have_timeout(obj) && obj->number > 0) {
			obj->timeout = (obj->timeout * n) / obj->number;
		}

		/* Accept change. */
		if (cmd_get_arg_choice(cmd, "update", &update) != CMD_OK ||
				update) {
			if (object_is_carried(player, obj)) {
				/*
				 * Remove the weight of the old number of
				 * objects.
				 */
				player->upkeep->total_weight -=
					obj->number * obj->weight;

				/*
				 * Add the weight of the new number of objects.
				 */
				player->upkeep->total_weight += n * obj->weight;
			}
			wiz_play_item_standard_upkeep(player, obj);
		} else {
			wiz_play_item_notify_changed();
		}
		obj->number = n;
	}
}